

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O2

int __thiscall QLCDNumberPrivate::init(QLCDNumberPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  int extraout_EAX;
  
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  QFrame::setFrameStyle((QFrame *)this_00,0x21);
  this->val = 0.0;
  this->field_0x288 = (this->field_0x288 & 0xf8) + 1;
  QLCDNumber::setDigitCount((QLCDNumber *)this_00,this->ndigits);
  QLCDNumber::setSegmentStyle((QLCDNumber *)this_00,Filled);
  QWidget::setSizePolicy(this_00,(QSizePolicy)0x110000);
  return extraout_EAX;
}

Assistant:

void QLCDNumberPrivate::init()
{
    Q_Q(QLCDNumber);

    q->setFrameStyle(QFrame::Box | QFrame::Raised);
    val        = 0;
    base       = QLCDNumber::Dec;
    smallPoint = false;
    q->setDigitCount(ndigits);
    q->setSegmentStyle(QLCDNumber::Filled);
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Minimum));
}